

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_KeyLog_Test::TestBody(SSLVersionTest_KeyLog_Test *this)

{
  UniquePtr<SSL> *out_client;
  _Head_base<0UL,_ssl_st_*,_false> _Var1;
  string sVar2;
  bool bVar3;
  int iVar4;
  ParamType *pPVar5;
  mapped_type *pmVar6;
  SSL_SESSION *pSVar7;
  size_t __n;
  undefined1 __ptr_00 [8];
  SSLVersionTest *this_00;
  SSLVersionTest *this_01;
  char *message;
  char *pcVar8;
  pointer *__ptr;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_;
  uint8_t *data;
  AssertionResult gtest_ar_3;
  size_t len;
  KeyLog client_log;
  KeyLog server_log;
  undefined1 local_148 [8];
  undefined1 local_140 [8];
  undefined1 local_138 [8];
  _Head_base<0UL,_evp_pkey_st_*,_false> _Stack_130;
  undefined1 local_128 [8];
  undefined1 auStack_120 [24];
  __uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter> _Stack_108;
  _Head_base<0UL,_ssl_st_*,_false> local_100;
  undefined1 local_f8 [8];
  undefined1 auStack_f0 [16];
  char *pcStack_e0;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_a8;
  AssertHelper local_98;
  Bytes local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_50;
  
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  SSL_CTX_set_ex_data((SSL_CTX *)
                      (this->super_SSLVersionTest).client_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0,&local_80);
  SSL_CTX_set_ex_data((SSL_CTX *)
                      (this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0,&local_50);
  SSL_CTX_set_keylog_callback
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
             TestBody::anon_class_1_0_00000001::__invoke);
  SSL_CTX_set_keylog_callback
            ((this->super_SSLVersionTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
             TestBody::anon_class_1_0_00000001::__invoke);
  local_d8._8_8_ = (GTestFlagSaver *)0x0;
  local_b8._8_8_ = (ssl_st *)0x0;
  local_f8 = (undefined1  [8])0x0;
  auStack_f0._0_8_ = (ssl_ctx_st *)0x0;
  pcStack_e0 = (char *)0x0;
  local_d8._0_8_ = (_func_int **)0x0;
  local_d8._24_8_ = (ssl_ctx_st *)0x0;
  local_b8._M_allocated_capacity = 0;
  local_a8._M_head_impl = (ssl_ctx_st *)0x0;
  out_client = &(this->super_SSLVersionTest).client_;
  bVar3 = (this->super_SSLVersionTest).shed_handshake_config_;
  pcVar8 = (char *)(ulong)bVar3;
  auStack_f0._8_8_ = (SSLVersionTest *)local_d8;
  local_d8._16_8_ = &local_b8;
  bVar3 = ConnectClientAndServer
                    (out_client,&(this->super_SSLVersionTest).server_,
                     (this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (ClientConfig *)local_f8,bVar3);
  local_128[0] = (internal)bVar3;
  auStack_120._0_8_ = (ssl_ctx_st *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._16_8_ != &local_b8) {
    operator_delete((void *)local_d8._16_8_,local_b8._M_allocated_capacity + 1);
  }
  this_00 = (SSLVersionTest *)auStack_f0._8_8_;
  if ((SSLVersionTest *)auStack_f0._8_8_ != (SSLVersionTest *)local_d8) {
    operator_delete((void *)auStack_f0._8_8_,(ulong)(local_d8._0_8_ + 1));
  }
  this_01 = (SSLVersionTest *)auStack_120;
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_128,(AssertionResult *)"Connect()","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x26cb,(char *)local_f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if (local_f8 != (undefined1  [8])((long)auStack_f0 + 8)) {
      operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
    }
    __ptr_00 = (undefined1  [8])auStack_120._0_8_;
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_138 !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_138 + 8))();
      __ptr_00 = (undefined1  [8])auStack_120._0_8_;
    }
LAB_001eabc4:
    if (__ptr_00 == (undefined1  [8])0x0) goto LAB_001eb496;
  }
  else {
    if ((_Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)auStack_120._0_8_ != (ssl_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_01,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_120._0_8_);
      this_00 = this_01;
    }
    bVar3 = SSLVersionTest::is_tls13(this_00);
    if (bVar3) {
      local_f8 = (undefined1  [8])0x34fa7a;
      auStack_f0._0_8_ = "SERVER_HANDSHAKE_TRAFFIC_SECRET";
      auStack_f0._8_8_ = "EXPORTER_SECRET";
      pcStack_e0 = "CLIENT_TRAFFIC_SECRET_0";
      local_d8._0_8_ = "CLIENT_HANDSHAKE_TRAFFIC_SECRET";
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>>>>
      ::operator()(local_128,local_f8,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)"client_log");
      if (local_128[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_f8);
        if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)auStack_120._0_8_ ==
            (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
          message = "";
        }
        else {
          message = *(char **)auStack_120._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26d3,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
        if (local_f8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)(RefCounted<ssl_session_st> *)local_f8 + 8))();
        }
      }
      if ((ssl_st *)auStack_120._0_8_ != (ssl_st *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_120._0_8_);
      }
      local_128 = (undefined1  [8])0x0;
      auStack_120._0_8_ = (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
      local_138 = (undefined1  [8])0x0;
      _Stack_130._M_head_impl = (evp_pkey_st *)0x0;
      pPVar5 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
      if (pPVar5->ssl_method == is_dtls) {
        iVar4 = SSL_get_dtls_read_traffic_secret
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                           (uint8_t **)(auStack_120 + 0x10),(size_t *)&local_90,3);
        local_148[0] = (internal)(iVar4 != 0);
        local_140 = (undefined1  [8])0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_100);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_148,
                     (AssertionResult *)
                     "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 3)","false",
                     "true",pcVar8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x26db,(char *)local_f8);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_100);
        }
        else {
          local_128 = (undefined1  [8])auStack_120._16_8_;
          auStack_120._0_8_ = local_90.span_.data_;
          iVar4 = SSL_get_dtls_write_traffic_secret
                            ((out_client->_M_t).
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                             (uint8_t **)(auStack_120 + 0x10),(size_t *)&local_90,3);
          local_148[0] = (internal)(iVar4 != 0);
          local_140 = (undefined1  [8])0x0;
          if (iVar4 != 0) {
            local_138 = (undefined1  [8])auStack_120._16_8_;
            _Stack_130._M_head_impl = (evp_pkey_st *)local_90.span_.data_;
            goto LAB_001eae0d;
          }
          testing::Message::Message((Message *)&local_100);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_148,
                     (AssertionResult *)
                     "SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 3)","false",
                     "true",pcVar8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x26de,(char *)local_f8);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_100);
        }
        this_01 = (SSLVersionTest *)local_140;
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_f8 != (undefined1  [8])(auStack_f0 + 8)) {
          operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
        }
        __ptr_00 = local_140;
        if (local_100._M_head_impl != (SSL *)0x0) {
          (*(local_100._M_head_impl)->method->ssl_new)(local_100._M_head_impl);
          __ptr_00 = local_140;
        }
        goto LAB_001eabc4;
      }
      bVar3 = SSL_get_traffic_secrets
                        ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                         (Span<const_unsigned_char> *)local_128,
                         (Span<const_unsigned_char> *)local_138);
      local_148[0] = (internal)bVar3;
      local_140 = (undefined1  [8])0x0;
      if (!bVar3) {
        testing::Message::Message((Message *)(auStack_120 + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_148,
                   (AssertionResult *)
                   "SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret)","false",
                   "true",pcVar8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26e2,(char *)local_f8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_90,(Message *)(auStack_120 + 0x10));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        if (local_f8 != (undefined1  [8])(auStack_f0 + 8)) {
          operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
        }
        if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)auStack_120._16_8_ !=
            (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(_func_int **)auStack_120._16_8_ + 8))();
        }
        if (local_140 != (undefined1  [8])0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140);
        }
        if (!bVar3) goto LAB_001eb496;
      }
LAB_001eae0d:
      auStack_120._16_8_ = local_128;
      _Stack_108._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
           (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
           (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)auStack_120._0_8_;
      _Var1._M_head_impl = (ssl_st *)(auStack_f0 + 8);
      local_f8 = (undefined1  [8])_Var1._M_head_impl;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"SERVER_TRAFFIC_SECRET_0","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             *)&local_80,(key_type *)local_f8);
      local_90.span_.data_ =
           (pmVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_90.span_.size_ =
           (long)(pmVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)local_90.span_.data_;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_148,"Bytes(read_secret)",
                 "Bytes(client_log[\"SERVER_TRAFFIC_SECRET_0\"])",(Bytes *)(auStack_120 + 0x10),
                 &local_90);
      if (local_f8 != (undefined1  [8])_Var1._M_head_impl) {
        operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
      }
      if (local_148[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_f8);
        if (local_140 == (undefined1  [8])0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)local_140;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(auStack_120 + 0x10),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26e6,pcVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(auStack_120 + 0x10),(Message *)local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_120 + 0x10));
        if (local_f8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)(RefCounted<ssl_session_st> *)local_f8 + 8))();
        }
      }
      if (local_140 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
        ;
      }
      auStack_120._16_8_ = local_138;
      _Stack_108._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
           (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
           (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)_Stack_130._M_head_impl;
      local_f8 = (undefined1  [8])_Var1._M_head_impl;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"CLIENT_TRAFFIC_SECRET_0","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             *)&local_80,(key_type *)local_f8);
      local_90.span_.data_ =
           (pmVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_90.span_.size_ =
           (long)(pmVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)local_90.span_.data_;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_148,"Bytes(write_secret)",
                 "Bytes(client_log[\"CLIENT_TRAFFIC_SECRET_0\"])",(Bytes *)(auStack_120 + 0x10),
                 &local_90);
      if (local_f8 != (undefined1  [8])_Var1._M_head_impl) {
        operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
      }
      if (local_148[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_f8);
        if (local_140 == (undefined1  [8])0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)local_140;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(auStack_120 + 0x10),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26e8,pcVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(auStack_120 + 0x10),(Message *)local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_120 + 0x10));
        if (local_f8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)(RefCounted<ssl_session_st> *)local_f8 + 8))();
        }
      }
      if (local_140 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
        ;
      }
    }
    else {
      local_128 = (undefined1  [8])0x34fb38;
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<char_const*>>>>
      ::operator()(local_f8,local_128,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)"client_log");
      if (local_f8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_128);
        if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)auStack_f0._0_8_ ==
            (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)auStack_f0._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26ea,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
        if (local_128 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_128 + 8))();
        }
      }
      if ((ssl_ctx_st *)auStack_f0._0_8_ != (ssl_ctx_st *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_f0._0_8_);
      }
      pSVar7 = SSL_get_session((SSL *)(out_client->_M_t).
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      __n = SSL_SESSION_get_master_key((SSL_SESSION *)pSVar7,(uint8_t *)0x0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,__n,
                 (allocator_type *)local_f8);
      pSVar7 = SSL_get_session((SSL *)(out_client->_M_t).
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      local_138 = (undefined1  [8])
                  SSL_SESSION_get_master_key
                            ((SSL_SESSION *)pSVar7,(uint8_t *)local_128,
                             auStack_120._0_8_ - (long)local_128);
      local_148 = (undefined1  [8])(auStack_120._0_8_ - (long)local_128);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_f8,
                 "SSL_SESSION_get_master_key(SSL_get_session(client_.get()), expected.data(), expected.size())"
                 ,"expected.size()",(unsigned_long *)local_138,(unsigned_long *)local_148);
      sVar2 = local_f8[0];
      if (local_f8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_138);
        if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)auStack_f0._0_8_ ==
            (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)auStack_f0._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_148,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26f1,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_138);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
        if (local_138 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_138 + 8))();
        }
        if ((ssl_ctx_st *)auStack_f0._0_8_ != (ssl_ctx_st *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_f0._0_8_);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_128 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_128,auStack_120._8_8_ - (long)local_128);
        }
        goto LAB_001eb496;
      }
      if ((ssl_ctx_st *)auStack_f0._0_8_ != (ssl_ctx_st *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_f0._0_8_);
      }
      local_140 = (undefined1  [8])(auStack_120._0_8_ - (long)local_128);
      local_148 = local_128;
      local_f8 = (undefined1  [8])((long)auStack_f0 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"CLIENT_RANDOM","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             *)&local_80,(key_type *)local_f8);
      auStack_120._16_8_ =
           (pmVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
      _Stack_108._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
           (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
           ((long)(pmVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - auStack_120._16_8_);
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_138,"Bytes(expected)","Bytes(client_log[\"CLIENT_RANDOM\"])",
                 (Bytes *)local_148,(Bytes *)(auStack_120 + 0x10));
      if (local_f8 != (undefined1  [8])((long)auStack_f0 + 8)) {
        operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
      }
      if (local_138[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_f8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            _Stack_130._M_head_impl ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)_Stack_130._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26f2,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
        if (local_f8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)(RefCounted<ssl_session_st> *)local_f8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          _Stack_130._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&_Stack_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_130._M_head_impl);
      }
      if (local_128 != (undefined1  [8])0x0) {
        operator_delete((void *)local_128,auStack_120._8_8_ - (long)local_128);
      }
      if (sVar2 == (string)0x0) goto LAB_001eb496;
    }
    testing::internal::
    CmpHelperEQ<std::map<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::map<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ((internal *)local_f8,"client_log","server_log",
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&local_80,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&local_50);
    if (local_f8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)auStack_f0._0_8_ ==
          (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)auStack_f0._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26f6,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((ssl_ctx_st *)auStack_f0._0_8_ == (ssl_ctx_st *)0x0) goto LAB_001eb496;
    this_01 = (SSLVersionTest *)auStack_f0;
    __ptr_00 = (undefined1  [8])auStack_f0._0_8_;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr_00);
LAB_001eb496:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

TEST_P(SSLVersionTest, KeyLog) {
  using KeyLog = std::map<std::string, std::vector<uint8_t>>;
  KeyLog client_log, server_log;

  SSL_CTX_set_app_data(client_ctx_.get(), &client_log);
  SSL_CTX_set_app_data(server_ctx_.get(), &server_log);

  auto keylog_callback = [](const SSL *ssl, const char *line) {
    SSL_CTX *ctx = SSL_get_SSL_CTX(ssl);
    KeyLog *log = static_cast<KeyLog *>(SSL_CTX_get_app_data(ctx));
    ASSERT_TRUE(log);

    const char *space1 = strchr(line, ' ');
    ASSERT_TRUE(space1);
    std::string name(line, space1 - line);
    space1++;
    const char *space2 = strchr(space1, ' ');
    ASSERT_TRUE(space2);
    bssl::Span<const char> client_random_hex(space1, space2 - space1);
    space2++;
    bssl::Span<const char> secret_hex(space2, strlen(space2));

    std::vector<uint8_t> client_random, secret;
    ASSERT_TRUE(DecodeLowerHex(&client_random, client_random_hex));
    ASSERT_TRUE(DecodeLowerHex(&secret, secret_hex));

    // The client_random field identifies the connection. Check it matches
    // the connection.
    uint8_t expected_random[SSL3_RANDOM_SIZE];
    ASSERT_EQ(
        sizeof(expected_random),
        SSL_get_client_random(ssl, expected_random, sizeof(expected_random)));
    ASSERT_EQ(Bytes(expected_random), Bytes(client_random));

    ASSERT_EQ(log->count(name), 0u) << "duplicate name " << name;
    log->emplace(std::move(name), std::move(secret));
  };
  SSL_CTX_set_keylog_callback(client_ctx_.get(), keylog_callback);
  SSL_CTX_set_keylog_callback(server_ctx_.get(), keylog_callback);

  // Connect and capture the various secrets.
  ASSERT_TRUE(Connect());

  // Check that we logged the secrets we expected to log.
  if (is_tls13()) {
    EXPECT_THAT(client_log, ElementsAre(Key("CLIENT_HANDSHAKE_TRAFFIC_SECRET"),
                                        Key("CLIENT_TRAFFIC_SECRET_0"),
                                        Key("EXPORTER_SECRET"),
                                        Key("SERVER_HANDSHAKE_TRAFFIC_SECRET"),
                                        Key("SERVER_TRAFFIC_SECRET_0")));

    Span<const uint8_t> read_secret, write_secret;
    if (is_dtls()) {
      // The first application data epoch is 3.
      const uint8_t *data;
      size_t len;
      ASSERT_TRUE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len,
                                                   /*epoch=*/3));
      read_secret = Span(data, len);
      ASSERT_TRUE(SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len,
                                                   /*epoch=*/3));
      write_secret = Span(data, len);
    } else {
      ASSERT_TRUE(
          SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret));
    }
    // Ideally we'd check the other values, but those are harder to check
    // without actually decrypting the records.
    EXPECT_EQ(Bytes(read_secret), Bytes(client_log["SERVER_TRAFFIC_SECRET_0"]));
    EXPECT_EQ(Bytes(write_secret),
              Bytes(client_log["CLIENT_TRAFFIC_SECRET_0"]));
  } else {
    EXPECT_THAT(client_log, ElementsAre(Key("CLIENT_RANDOM")));

    size_t len =
        SSL_SESSION_get_master_key(SSL_get0_session(client_.get()), nullptr, 0);
    std::vector<uint8_t> expected(len);
    ASSERT_EQ(SSL_SESSION_get_master_key(SSL_get0_session(client_.get()),
                                         expected.data(), expected.size()),
              expected.size());
    EXPECT_EQ(Bytes(expected), Bytes(client_log["CLIENT_RANDOM"]));
  }

  // The server should have logged the same secrets as the client.
  EXPECT_EQ(client_log, server_log);
}